

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *in_RDI;
  int cached_size;
  int n;
  int i;
  DescriptorProto_ReservedRange *msg_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *__range2_6;
  OneofDescriptorProto *msg_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *__range2_5;
  FieldDescriptorProto *msg_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2_4;
  DescriptorProto_ExtensionRange *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *__range2_3;
  EnumDescriptorProto *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range2_2;
  DescriptorProto *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2_1;
  FieldDescriptorProto *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  int iVar5;
  reference in_stack_fffffffffffffee0;
  iterator local_118;
  RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ReservedRange> local_110;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *local_108;
  reference local_100;
  iterator local_f8;
  RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto> local_f0;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *local_e8;
  reference local_e0;
  iterator local_d8;
  RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto> local_d0;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *local_c8;
  reference local_c0;
  iterator local_b8;
  RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ExtensionRange> local_b0;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *local_a8;
  reference local_a0;
  iterator local_98;
  RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto> local_90;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *local_88;
  reference local_80;
  iterator local_78;
  RepeatedPtrIterator<const_google::protobuf::DescriptorProto> local_70;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_68;
  reference local_60;
  iterator local_58;
  RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto> local_50;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *local_48;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  int *local_20;
  undefined4 local_14;
  Rep **local_10;
  int *local_8;
  
  local_38 = 0;
  local_3c = 0;
  iVar3 = _internal_field_size((DescriptorProto *)0x4f7457);
  local_38 = (long)iVar3 + local_38;
  local_48 = in_RDI + 1;
  local_50.it_ = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(in_RDI);
  local_58.it_ = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                 operator!=(&local_50,&local_58), bVar2) {
    local_60 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
               operator*(&local_50);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      ((FieldDescriptorProto *)0x4f74e7);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
              (&local_50);
  }
  iVar3 = _internal_nested_type_size((DescriptorProto *)0x4f750f);
  local_38 = (long)iVar3 + local_38;
  local_68 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)in_RDI + 2;
  local_70.it_ = (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_RDI);
  local_78.it_ = (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::DescriptorProto> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator!=
                           (&local_70,&local_78), bVar2) {
    local_80 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                         (&local_70);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>
                      ((DescriptorProto *)0x4f759f);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&local_70);
  }
  iVar3 = _internal_enum_type_size((DescriptorProto *)0x4f75c7);
  local_38 = (long)iVar3 + local_38;
  local_88 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_RDI + 3;
  local_90.it_ = (void **)RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                                     in_RDI);
  local_98.it_ = (void **)RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::
                 operator!=(&local_90,&local_98), bVar2) {
    local_a0 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator*
                         (&local_90);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>
                      ((EnumDescriptorProto *)0x4f7657);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++
              (&local_90);
  }
  iVar3 = _internal_extension_range_size((DescriptorProto *)0x4f767f);
  local_38 = (long)iVar3 + local_38;
  local_a8 = (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)in_RDI + 4;
  local_b0.it_ = (void **)RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::begin
                                    ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>
                                      *)in_RDI);
  local_b8.it_ = (void **)RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::end
                                    ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>
                                      *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                                                ));
  while (bVar2 = internal::
                 RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ExtensionRange>::
                 operator!=(&local_b0,&local_b8), bVar2) {
    local_c0 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ExtensionRange>
               ::operator*(&local_b0);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ExtensionRange>
                      ((DescriptorProto_ExtensionRange *)0x4f7709);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ExtensionRange>::
    operator++(&local_b0);
  }
  iVar3 = _internal_extension_size((DescriptorProto *)0x4f7731);
  local_38 = (long)iVar3 + local_38;
  local_c8 = in_RDI + 5;
  local_d0.it_ = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(in_RDI);
  local_d8.it_ = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                 operator!=(&local_d0,&local_d8), bVar2) {
    local_e0 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
               operator*(&local_d0);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      ((FieldDescriptorProto *)0x4f77a3);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
              (&local_d0);
  }
  iVar3 = _internal_oneof_decl_size((DescriptorProto *)0x4f77c8);
  local_38 = (long)iVar3 + local_38;
  local_e8 = (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_RDI + 6;
  local_f0.it_ = (void **)RepeatedPtrField<google::protobuf::OneofDescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)
                                     in_RDI);
  local_f8.it_ = (void **)RepeatedPtrField<google::protobuf::OneofDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)
                                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::
                 operator!=(&local_f0,&local_f8), bVar2) {
    local_100 = internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::
                operator*(&local_f0);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::OneofDescriptorProto>
                      ((OneofDescriptorProto *)0x4f783c);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::operator++
              (&local_f0);
  }
  iVar3 = _internal_reserved_range_size((DescriptorProto *)0x4f7861);
  local_38 = (long)iVar3 + local_38;
  local_108 = (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)in_RDI + 7;
  local_110.it_ =
       (void **)RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::begin
                          ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
                           in_RDI);
  local_118.it_ =
       (void **)RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::end
                          ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar2 = internal::
                 RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ReservedRange>::
                 operator!=(&local_110,&local_118), bVar2) {
    in_stack_fffffffffffffee0 =
         internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ReservedRange>::
         operator*(&local_110);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ReservedRange>
                      ((DescriptorProto_ReservedRange *)0x4f78d5);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ReservedRange>::operator++
              (&local_110);
  }
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x4f7901);
  sVar4 = internal::FromIntSize(iVar3);
  local_38 = sVar4 + local_38;
  iVar5 = 0;
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x4f7934);
  for (; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = internal::WireFormatLite::StringSize((string *)0x4f795e);
    local_38 = sVar4 + local_38;
  }
  local_10 = &(((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)in_RDI)->
              super_RepeatedPtrFieldBase).rep_;
  local_14 = 0;
  local_3c = *(uint *)local_10;
  if ((local_3c & 3) != 0) {
    if ((local_3c & 1) != 0) {
      _internal_name_abi_cxx11_((DescriptorProto *)0x4f79d7);
      sVar4 = internal::WireFormatLite::StringSize((string *)0x4f79df);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::MessageOptions>
                        ((MessageOptions *)0x4f7a12);
      local_38 = sVar4 + 1 + local_38;
    }
  }
  local_20 = &(((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)in_RDI)->
              super_RepeatedPtrFieldBase).current_size_;
  uVar1 = (((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)in_RDI)->
          super_RepeatedPtrFieldBase).current_size_;
  local_8 = local_20;
  if ((uVar1 & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_stack_fffffffffffffee0,
                          CONCAT44(iVar5,iVar3),
                          (CachedSize *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  else {
    iVar3 = internal::ToCachedSize(local_38);
    SetCachedSize((DescriptorProto *)CONCAT44(iVar3,in_stack_fffffffffffffed0),
                  (int)((ulong)in_RDI >> 0x20));
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t DescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  total_size += 1UL * this->_internal_field_size();
  for (const auto& msg : this->field_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  total_size += 1UL * this->_internal_nested_type_size();
  for (const auto& msg : this->nested_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  total_size += 1UL * this->_internal_enum_type_size();
  for (const auto& msg : this->enum_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  total_size += 1UL * this->_internal_extension_range_size();
  for (const auto& msg : this->extension_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  total_size += 1UL * this->_internal_extension_size();
  for (const auto& msg : this->extension_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  total_size += 1UL * this->_internal_oneof_decl_size();
  for (const auto& msg : this->oneof_decl_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  total_size += 1UL * this->_internal_reserved_range_size();
  for (const auto& msg : this->reserved_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string reserved_name = 10;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(reserved_name_.size());
  for (int i = 0, n = reserved_name_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      reserved_name_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}